

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O1

int UNPK_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  int iVar1;
  void *pvVar2;
  PHYSFS_sint64 PVar3;
  
  pvVar2 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar2 == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    if (*(int *)((long)pvVar2 + 0x20) == 0) {
      stat->filetype = PHYSFS_FILETYPE_REGULAR;
      PVar3 = *(PHYSFS_sint64 *)((long)pvVar2 + 0x30);
    }
    else {
      stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
      PVar3 = 0;
    }
    stat->filesize = PVar3;
    stat->modtime = *(PHYSFS_sint64 *)((long)pvVar2 + 0x40);
    stat->createtime = *(PHYSFS_sint64 *)((long)pvVar2 + 0x38);
    stat->accesstime = -1;
    stat->readonly = 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int UNPK_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    UNPKinfo *info = (UNPKinfo *) opaque;
    const UNPKentry *entry = findEntry(info, path);

    BAIL_IF_ERRPASS(!entry, 0);

    if (entry->tree.isdir)
    {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->filesize = 0;
    } /* if */
    else
    {
        stat->filetype = PHYSFS_FILETYPE_REGULAR;
        stat->filesize = entry->size;
    } /* else */

    stat->modtime = entry->mtime;
    stat->createtime = entry->ctime;
    stat->accesstime = -1;
    stat->readonly = 1;

    return 1;
}